

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void PrintIOExp(uint32_t iodata)

{
  void *pvVar1;
  ostream *poVar2;
  bool output_error;
  uint32_t iodata_local;
  
  pvVar1 = (void *)std::ostream::operator<<(&std::cout,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar1,iodata & 0xffff);
  std::operator<<(poVar2,"  :");
  if ((iodata & 0x1000000) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout," output_error (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(iodata & 0xff0000) >> 0x10);
    std::operator<<(poVar2,") ");
  }
  if ((iodata & 0x2000000) != 0) {
    std::operator<<((ostream *)&std::cout," read_error");
  }
  if ((iodata & 0x4000000) != 0) {
    std::operator<<((ostream *)&std::cout," do_reg_io");
  }
  if ((iodata & 0x8000000) != 0) {
    std::operator<<((ostream *)&std::cout," reg_io_read");
  }
  if ((iodata & 0x10000000) != 0) {
    std::operator<<((ostream *)&std::cout," other_busy");
  }
  pvVar1 = (void *)std::ostream::operator<<(&std::cout,std::dec);
  std::ostream::operator<<(pvVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintIOExp(uint32_t iodata)
{
    std::cout << std::hex << (iodata&0x0000ffff) << "  :";
    bool output_error = iodata&0x01000000;
    if (output_error)
        std::cout << " output_error (" << ((iodata&0x00ff0000)>>16) << ") ";
    if (iodata&0x02000000) std::cout << " read_error";
    if (iodata&0x04000000) std::cout << " do_reg_io";
    if (iodata&0x08000000) std::cout << " reg_io_read";
    if (iodata&0x10000000) std::cout << " other_busy";
    std::cout << std::dec << std::endl;
}